

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O1

int __thiscall jrtplib::RTPPacketBuilder::DeleteCSRC(RTPPacketBuilder *this,uint32_t csrc)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  iVar4 = -0x14;
  if (this->init == true) {
    iVar2 = this->numcsrcs;
    if (iVar2 < 1) {
      uVar5 = 0;
      bVar3 = false;
    }
    else {
      bVar3 = false;
      uVar5 = 0;
      do {
        bVar6 = this->csrcs[uVar5] != csrc;
        if (!bVar6) {
          bVar3 = true;
        }
        uVar5 = bVar6 + uVar5;
      } while ((!bVar3) && ((int)uVar5 < iVar2));
    }
    iVar4 = -0xf;
    if (bVar3) {
      uVar1 = iVar2 - 1;
      this->numcsrcs = uVar1;
      iVar4 = 0;
      if ((1 < iVar2) && (uVar1 != uVar5)) {
        this->csrcs[(int)uVar5] = this->csrcs[uVar1];
      }
    }
  }
  return iVar4;
}

Assistant:

int RTPPacketBuilder::DeleteCSRC(uint32_t csrc)
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	
	int i = 0;
	bool found = false;

	while (!found && i < numcsrcs)
	{
		if (csrcs[i] == csrc)
			found = true;
		else
			i++;
	}

	if (!found)
		return ERR_RTP_PACKBUILD_CSRCNOTINLIST;
	
	// move the last csrc in the place of the deleted one
	numcsrcs--;
	if (numcsrcs > 0 && numcsrcs != i)
		csrcs[i] = csrcs[numcsrcs];
	return 0;
}